

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_ldm_getTableSize(ldmParams_t params)

{
  size_t sVar1;
  byte bVar2;
  int in_stack_00000008;
  uint in_stack_0000000c;
  uint in_stack_00000010;
  size_t totalSize;
  size_t ldmBucketSize;
  size_t ldmBucketSizeLog;
  size_t ldmHSize;
  size_t local_40;
  byte local_2c;
  
  bVar2 = (byte)in_stack_0000000c;
  local_2c = bVar2;
  if (in_stack_00000010 < in_stack_0000000c) {
    local_2c = (byte)in_stack_00000010;
  }
  local_40 = ZSTD_cwksp_alloc_size(1L << (bVar2 - local_2c & 0x3f));
  sVar1 = ZSTD_cwksp_alloc_size((1L << (bVar2 & 0x3f)) << 3);
  local_40 = local_40 + sVar1;
  if (in_stack_00000008 != 1) {
    local_40 = 0;
  }
  return local_40;
}

Assistant:

size_t ZSTD_ldm_getTableSize(ldmParams_t params)
{
    size_t const ldmHSize = ((size_t)1) << params.hashLog;
    size_t const ldmBucketSizeLog = MIN(params.bucketSizeLog, params.hashLog);
    size_t const ldmBucketSize = ((size_t)1) << (params.hashLog - ldmBucketSizeLog);
    size_t const totalSize = ZSTD_cwksp_alloc_size(ldmBucketSize)
                           + ZSTD_cwksp_alloc_size(ldmHSize * sizeof(ldmEntry_t));
    return params.enableLdm == ZSTD_ps_enable ? totalSize : 0;
}